

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
::Initialize(BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
             *this,int capacity)

{
  code *pcVar1;
  bool bVar2;
  uint bucketCount;
  undefined4 *puVar3;
  DictionaryStats *pDVar4;
  uint size;
  int *local_48;
  int *newBuckets;
  EntryType *newEntries;
  int modIndex;
  
  size = 4;
  if (4 < capacity) {
    size = capacity;
  }
  newEntries._4_4_ = 0x4b;
  bucketCount = DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>::GetBucketSize
                          (size,(int *)((long)&newEntries + 4));
  if (bucketCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x380,"(initBucketCount > 0)",
                       "Size returned by policy should be greater than 0");
    if (!bVar2) goto LAB_007dac8a;
    *puVar3 = 0;
  }
  local_48 = (Type)0x0;
  newBuckets = (int *)0x0;
  Allocate(this,&local_48,(EntryType **)&newBuckets,bucketCount,size);
  this->buckets = local_48;
  this->entries = (Type)newBuckets;
  this->bucketCount = bucketCount;
  this->size = size;
  this->modFunctionIndex = newEntries._4_4_;
  if (this->freeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x38c,"(this->freeCount == 0)","this->freeCount == 0");
    if (!bVar2) {
LAB_007dac8a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    size = this->size;
  }
  pDVar4 = DictionaryStats::Create
                     ("PN6JsUtil14BaseDictionaryINS_15CharacterBufferIDsEEP6SymbolN6Memory14ArenaAllocatorE20DictionarySizePolicyI11PrimePolicyLj2ELj2ELj1ELj4EE15DefaultComparerNS_11HashedEntryENS_12NoResizeLockEEE"
                      ,size);
  this->stats = pDVar4;
  return;
}

Assistant:

void Initialize(int capacity)
        {
            // minimum capacity is 4
            int initSize = max(capacity, 4);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint initBucketCount = SizePolicy::GetBucketSize(initSize, &modIndex);
            AssertMsg(initBucketCount > 0, "Size returned by policy should be greater than 0");

            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            Allocate(&newBuckets, &newEntries, initBucketCount, initSize);

            // Allocation can throw - assign only after allocation has succeeded.
            this->buckets = newBuckets;
            this->entries = newEntries;
            this->bucketCount = initBucketCount;
            this->size = initSize;
            this->modFunctionIndex = modIndex;
            Assert(this->freeCount == 0);
#if PROFILE_DICTIONARY
            stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
        }